

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyarrayblkof.c
# Opt level: O0

void tommy_arrayblkof_done(tommy_arrayblkof *array)

{
  long lVar1;
  tommy_count_t tVar2;
  void *ptr;
  long in_FS_OFFSET;
  undefined4 local_1c;
  tommy_count_t i;
  tommy_arrayblkof *array_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_1c = 0;
  while( true ) {
    tVar2 = tommy_array_size(&array->block);
    if (tVar2 <= local_1c) break;
    ptr = tommy_array_get(&array->block,local_1c);
    lrtr_free(ptr);
    local_1c = local_1c + 1;
  }
  tommy_array_done(&array->block);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void tommy_arrayblkof_done(tommy_arrayblkof* array)
{
	tommy_count_t i;

	for (i = 0; i < tommy_array_size(&array->block); ++i)
		tommy_free(tommy_array_get(&array->block, i));

	tommy_array_done(&array->block);
}